

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O3

void Cmd_menu_endgame(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  undefined8 in_RAX;
  DMenu *menu;
  undefined8 local_18;
  
  local_18 = in_RAX;
  if (usergame) {
    iVar1 = S_FindSound("menu/activate");
    local_18 = CONCAT44(local_18._4_4_,iVar1);
    S_Sound(0x22,(FSoundID *)&local_18,snd_menuvolume.Value,0.0);
    menu = (DMenu *)M_Malloc_Dbg(0x50,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                                 ,0x1f9);
    DEndGameMenu::DEndGameMenu((DEndGameMenu *)menu,false);
    (menu->mParentMenu).field_0.p = DMenu::CurrentMenu;
    M_ActivateMenu(menu);
  }
  else {
    iVar1 = S_FindSound("menu/invalid");
    local_18 = CONCAT44(iVar1,local_18._0_4_);
    S_Sound(0x22,(FSoundID *)((long)&local_18 + 4),snd_menuvolume.Value,0.0);
  }
  return;
}

Assistant:

CCMD (menu_endgame)
{	// F7
	if (!usergame)
	{
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/invalid", snd_menuvolume, ATTN_NONE);
		return;
	}
		
	//M_StartControlPanel (true);
	S_Sound (CHAN_VOICE | CHAN_UI, "menu/activate", snd_menuvolume, ATTN_NONE);
	DMenu *newmenu = new DEndGameMenu(false);
	newmenu->mParentMenu = DMenu::CurrentMenu;
	M_ActivateMenu(newmenu);
}